

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int jsonTranslateTextToBlob(JsonParse *pParse,u32 i)

{
  byte *__s1;
  byte bVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  u32 uVar4;
  char *pcVar5;
  bool bVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  size_t sVar15;
  ulong uVar16;
  char *aPayload;
  u32 uVar17;
  ulong uVar18;
  long lVar19;
  char cVar20;
  u8 uVar21;
  u32 uVar22;
  ulong uVar23;
  u32 szPayload;
  long in_FS_OFFSET;
  int local_3c;
  long local_38;
  
  uVar18 = (ulong)i;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar5 = pParse->zJson;
  do {
    uVar12 = (uint)uVar18;
    __s1 = (byte *)(pcVar5 + uVar18);
    bVar8 = pcVar5[uVar18];
    uVar10 = 0xffffffff;
    uVar11 = uVar10;
    switch(bVar8) {
    case 0:
      goto switchD_001a3541_caseD_0;
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x21:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x28:
    case 0x29:
    case 0x2a:
      goto switchD_001a3541_caseD_1;
    case 9:
    case 10:
    case 0xd:
    case 0x20:
      sVar15 = strspn(pcVar5 + (uVar12 + 1),"\t\n\r ");
      uVar18 = (ulong)(uVar12 + (int)sVar15 + 1);
      break;
    case 0xb:
    case 0xc:
    case 0x2f:
switchD_001a3541_caseD_b:
      iVar9 = json5Whitespace((char *)__s1);
      if (iVar9 == 0) goto LAB_001a3a14;
      pParse->hasNonstd = '\x01';
      uVar18 = (ulong)(iVar9 + uVar12);
      break;
    case 0x27:
      pParse->hasNonstd = '\x01';
      bVar8 = *__s1;
    case 0x22:
      uVar21 = '\a';
      uVar10 = uVar12 + 1;
      goto LAB_001a363c;
    case 0x2b:
      pParse->hasNonstd = '\x01';
      bVar8 = *__s1;
    case 0x2d:
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      if ((char)bVar8 < '1') {
        uVar11 = uVar12 + 1;
        bVar7 = pcVar5[uVar11];
        uVar16 = (ulong)bVar7;
        if (bVar8 == 0x30) {
          if (((bVar7 | 0x20) == 0x78) &&
             (uVar23 = (ulong)(uVar12 + 2), (""[(byte)pcVar5[uVar23]] & 8) != 0)) {
            pParse->hasNonstd = '\x01';
            do {
              uVar11 = (int)uVar23 + 1;
              uVar23 = (ulong)uVar11;
            } while ((""[(byte)pcVar5[uVar23]] & 8) != 0);
LAB_001a395e:
            bVar7 = 1;
            goto LAB_001a3960;
          }
          if (uVar16 - 0x3a < 0xfffffffffffffff6) goto LAB_001a393d;
LAB_001a3944:
          pParse->iErr = uVar11;
          goto LAB_001a3ec9;
        }
        if (uVar16 - 0x3a < 0xfffffffffffffff6) {
          if (uVar16 == 0x2e) {
            bVar8 = 1;
LAB_001a3da4:
            pParse->hasNonstd = '\x01';
            goto LAB_001a3da8;
          }
          if (((bVar7 != 0x69) && (bVar7 != 0x49)) ||
             (iVar9 = sqlite3_strnicmp(pcVar5 + uVar11,"inf",3), iVar9 != 0)) {
LAB_001a38fa:
            pParse->iErr = uVar12;
            goto LAB_001a3ec9;
          }
          pParse->hasNonstd = '\x01';
          if (*__s1 == 0x2d) {
            aPayload = "-9e999";
            uVar17 = 6;
          }
          else {
            aPayload = "9e999";
            uVar17 = 5;
          }
          jsonBlobAppendNode(pParse,'\x05',uVar17,aPayload);
          iVar9 = sqlite3_strnicmp(pcVar5 + (uVar12 + 4),"inity",5);
          uVar11 = uVar12 + (uint)(iVar9 == 0) * 5 + 4;
          goto LAB_001a3ecc;
        }
        if (bVar7 == 0x30) {
          if (0xfffffffffffffff5 < (ulong)(byte)pcVar5[uVar12 + 2] - 0x3a) goto LAB_001a3944;
          if (((byte)(pcVar5[uVar12 + 2] | 0x20U) == 0x78) &&
             (uVar16 = (ulong)(uVar12 + 3), (""[(byte)pcVar5[uVar16]] & 8) != 0)) {
            pParse->hasNonstd = '\x01';
            do {
              uVar11 = (int)uVar16 + 1;
              uVar16 = (ulong)uVar11;
            } while ((""[(byte)pcVar5[uVar16]] & 8) != 0);
            goto LAB_001a395e;
          }
        }
LAB_001a393d:
        bVar8 = 0;
      }
      else {
        bVar8 = 0;
      }
LAB_001a3da8:
      bVar6 = true;
      goto LAB_001a3dad;
    case 0x2c:
      pParse->iErr = uVar12;
      uVar11 = 0xfffffffc;
      goto LAB_001a3ecc;
    case 0x2e:
      bVar8 = 3;
      if ((ulong)(byte)pcVar5[uVar12 + 1] - 0x3a < 0xfffffffffffffff6) goto LAB_001a38fa;
      goto LAB_001a3da4;
    case 0x3a:
      pParse->iErr = uVar12;
      uVar11 = 0xfffffffb;
      goto LAB_001a3ecc;
    default:
      if ((bVar8 - 0xc2 < 0x2e) && ((0x200380000001U >> ((ulong)(bVar8 - 0xc2) & 0x3f) & 1) != 0))
      goto switchD_001a3541_caseD_b;
      if (bVar8 == 0x5b) {
        uVar17 = pParse->nBlob;
        jsonBlobAppendNode(pParse,'\v',pParse->nJson - uVar12,(void *)0x0);
        if (pParse->oom != '\0') goto LAB_001a3ecc;
        uVar4 = pParse->nBlob;
        uVar3 = pParse->iDepth;
        pParse->iDepth = uVar3 + 1;
        if ((ushort)(uVar3 + 1) < 0x3e9) goto LAB_001a3f20;
        pParse->iErr = uVar12;
        goto LAB_001a3ecc;
      }
      if (bVar8 == 0x5d) {
        pParse->iErr = uVar12;
        uVar11 = 0xfffffffd;
        goto LAB_001a3ecc;
      }
      if (bVar8 == 0x66) {
        iVar9 = strncmp((char *)__s1,"false",5);
        if ((iVar9 == 0) && (uVar11 = uVar12 + 5, (""[(byte)pcVar5[uVar11]] & 6) == 0)) {
          uVar21 = '\x02';
          goto LAB_001a4001;
        }
LAB_001a3a14:
        pParse->iErr = uVar12;
        uVar11 = uVar10;
        goto LAB_001a3ecc;
      }
      if (bVar8 == 0x6e) {
        iVar9 = strncmp((char *)__s1,"null",4);
        if ((iVar9 == 0) && (uVar11 = uVar12 + 4, (""[(byte)pcVar5[uVar11]] & 6) == 0)) {
          uVar21 = '\0';
          goto LAB_001a4001;
        }
      }
      else {
        if (bVar8 == 0x74) {
          iVar9 = strncmp((char *)__s1,"true",4);
          if ((iVar9 != 0) || (uVar11 = uVar12 + 4, (""[(byte)pcVar5[uVar11]] & 6) != 0)) {
            pParse->iErr = uVar12;
            goto LAB_001a3b16;
          }
          uVar21 = '\x01';
LAB_001a4001:
          jsonBlobAppendOneByte(pParse,uVar21);
          goto LAB_001a3ecc;
        }
        if (bVar8 == 0x7d) {
          pParse->iErr = uVar12;
          uVar11 = 0xfffffffe;
          goto LAB_001a3ecc;
        }
        if (bVar8 == 0x7b) {
          uVar17 = pParse->nBlob;
          jsonBlobAppendNode(pParse,'\f',pParse->nJson - uVar12,(void *)0x0);
          uVar2 = pParse->iDepth;
          pParse->iDepth = uVar2 + 1;
          if (1000 < (ushort)(uVar2 + 1)) goto LAB_001a3601;
          uVar4 = pParse->nBlob;
          goto LAB_001a3b4d;
        }
      }
switchD_001a3541_caseD_1:
      lVar19 = 0;
      goto LAB_001a3a6e;
    }
  } while( true );
LAB_001a3f20:
  uVar22 = (int)uVar18 + 1;
  uVar11 = jsonTranslateTextToBlob(pParse,uVar22);
  uVar18 = (ulong)uVar11;
  if ((int)uVar11 < 1) goto LAB_001a4022;
  bVar8 = pcVar5[uVar18];
  if (bVar8 != 0x2c) {
    if (bVar8 == 0x5d) goto LAB_001a4073;
    if (""[bVar8] != '\0') {
      sVar15 = strspn(pcVar5 + uVar18 + 1,"\t\n\r ");
      uVar11 = uVar11 + (int)sVar15 + 1;
      uVar18 = (ulong)uVar11;
      if (pcVar5[uVar18] == ',') goto LAB_001a3f20;
      if (pcVar5[uVar18] == ']') goto LAB_001a4073;
    }
    iVar9 = jsonTranslateTextToBlob(pParse,uVar11);
    if (iVar9 != -4) {
      if (iVar9 != -3) {
        pParse->iErr = uVar11;
        uVar11 = uVar10;
        goto LAB_001a3ecc;
      }
      uVar11 = pParse->iErr;
      goto LAB_001a4073;
    }
    uVar18 = (ulong)pParse->iErr;
  }
  goto LAB_001a3f20;
LAB_001a3b4d:
  do {
    iVar9 = (int)uVar18;
    uVar22 = iVar9 + 1;
    uVar11 = pParse->nBlob;
    uVar10 = jsonTranslateTextToBlob(pParse,uVar22);
    if (0 < (int)uVar10) {
LAB_001a3b6e:
      uVar18 = (ulong)uVar10;
      if (pParse->oom == '\0') {
        if (0xfb < (byte)((pParse->aBlob[uVar11] & 0xf) - 0xb)) {
          if ((ulong)(byte)pcVar5[uVar18] == 0x3a) {
LAB_001a3bd3:
            uVar10 = uVar10 + 1;
            uVar12 = jsonTranslateTextToBlob(pParse,uVar10);
            uVar18 = (ulong)uVar12;
            if (0 < (int)uVar12) {
              bVar8 = pcVar5[uVar18];
              if (bVar8 != 0x2c) {
                if (bVar8 == 0x7d) goto LAB_001a40b3;
                if (""[bVar8] != '\0') {
                  sVar15 = strspn(pcVar5 + uVar18 + 1,"\t\n\r ");
                  uVar12 = uVar12 + (int)sVar15 + 1;
                  uVar18 = (ulong)uVar12;
                  if (pcVar5[uVar18] == ',') goto LAB_001a3c51;
                  if (pcVar5[uVar18] == '}') goto LAB_001a40b3;
                }
                iVar9 = jsonTranslateTextToBlob(pParse,(u32)uVar18);
                if (iVar9 != -4) {
                  if (iVar9 != -2) goto LAB_001a3601;
                  uVar12 = pParse->iErr;
                  goto LAB_001a40b3;
                }
                uVar18 = (ulong)pParse->iErr;
              }
LAB_001a3c51:
              iVar9 = 6;
              goto LAB_001a3d5c;
            }
            if (uVar12 == 0xffffffff) goto LAB_001a3b16;
          }
          else {
            if (""[(byte)pcVar5[uVar18]] != '\0') {
              do {
                uVar10 = (int)uVar18 + 1;
                uVar18 = (ulong)uVar10;
              } while (""[(byte)pcVar5[uVar18]] != '\0');
              if (pcVar5[uVar18] == 0x3a) goto LAB_001a3bd3;
            }
            uVar11 = jsonTranslateTextToBlob(pParse,uVar10);
            if (uVar11 == 0xfffffffb) {
              uVar10 = pParse->iErr;
              goto LAB_001a3bd3;
            }
            if (uVar11 == 0xffffffff) goto LAB_001a3ecc;
          }
          pParse->iErr = uVar10;
          goto LAB_001a3b16;
        }
        pParse->iErr = uVar22;
      }
      uVar11 = 0xffffffff;
      goto LAB_001a3ecc;
    }
    if (uVar10 == 0xfffffffe) {
      uVar18 = (ulong)pParse->iErr;
      if (pParse->nBlob != uVar4) {
        pParse->hasNonstd = '\x01';
      }
      iVar9 = 4;
    }
    else {
      iVar13 = json5Whitespace(pcVar5 + uVar22);
      uVar22 = uVar22 + iVar13;
      uVar18 = (ulong)uVar22;
      local_3c = 7;
      if (((""[(byte)pcVar5[uVar18]] & 0x42) != 0) ||
         ((pcVar5[uVar18] == 0x5c &&
          (iVar14 = jsonIs4HexB(pcVar5 + (uVar22 + 1),&local_3c), iVar14 != 0)))) {
        iVar9 = iVar13 + iVar9 + 3;
        szPayload = 1;
        while( true ) {
          uVar10 = iVar9 - 1;
          bVar8 = pcVar5[(int)uVar10];
          if ((((""[bVar8] & 0x46) == 0) ||
              (iVar13 = json5Whitespace(pcVar5 + (int)uVar10), iVar13 != 0)) &&
             ((bVar8 != 0x5c || (iVar13 = jsonIs4HexB(pcVar5 + iVar9,&local_3c), iVar13 == 0))))
          break;
          iVar9 = iVar9 + 1;
          szPayload = szPayload + 1;
        }
        jsonBlobAppendNode(pParse,(u8)local_3c,szPayload,pcVar5 + uVar18);
        pParse->hasNonstd = '\x01';
        goto LAB_001a3b6e;
      }
      if (uVar10 != 0xffffffff) {
        pParse->iErr = uVar22;
      }
      iVar9 = 1;
    }
LAB_001a3d5c:
    uVar12 = (uint)uVar18;
  } while (iVar9 == 6);
  uVar11 = 0xffffffff;
  if (iVar9 == 4) {
LAB_001a40b3:
    jsonBlobChangePayloadSize(pParse,uVar17,pParse->nBlob - uVar4);
    pParse->iDepth = pParse->iDepth - 1;
    uVar11 = uVar12 + 1;
  }
  goto LAB_001a3ecc;
LAB_001a3601:
  pParse->iErr = (u32)uVar18;
LAB_001a3b16:
  uVar11 = 0xffffffff;
  goto LAB_001a3ecc;
LAB_001a3dad:
  bVar7 = bVar8;
  while( true ) {
    do {
      uVar16 = uVar18;
      iVar9 = (int)uVar16;
      uVar11 = iVar9 + 1;
      uVar18 = (ulong)uVar11;
      bVar1 = pcVar5[uVar18];
    } while (0xfffffffffffffff5 < (ulong)bVar1 - 0x3a);
    if (bVar1 != 0x2e) break;
    bVar1 = bVar7 & 2;
    bVar7 = bVar8 | 2;
    if (bVar1 != 0) goto LAB_001a3ec5;
  }
  cVar20 = pcVar5[uVar16];
  if ((bVar1 & 0xdf) == 0x45) {
    if (cVar20 < '0') {
      if (((cVar20 != '.') || (iVar9 - 1U < uVar12)) ||
         ((ulong)(byte)pcVar5[iVar9 - 1U] - 0x3a < 0xfffffffffffffff6)) goto LAB_001a3ec5;
      pParse->hasNonstd = '\x01';
      bVar7 = bVar7 | 1;
    }
    if (!bVar6) goto LAB_001a3ec5;
    cVar20 = pcVar5[iVar9 + 2];
    if ((cVar20 == '-') || (cVar20 == '+')) {
      cVar20 = pcVar5[iVar9 + 3];
      uVar18 = (ulong)(iVar9 + 2);
    }
    bVar8 = bVar7 | 2;
    bVar6 = false;
    if ((byte)(cVar20 - 0x3aU) < 0xf6) goto code_r0x001a3e62;
    goto LAB_001a3dad;
  }
  if ('/' < cVar20) goto LAB_001a3960;
  if (((cVar20 != '.') || (iVar9 - 1U < uVar12)) ||
     ((ulong)(byte)pcVar5[iVar9 - 1U] - 0x3a < 0xfffffffffffffff6)) {
LAB_001a3ec5:
    pParse->iErr = uVar11;
    goto LAB_001a3ec9;
  }
  pParse->hasNonstd = '\x01';
  bVar7 = bVar7 | 1;
LAB_001a3960:
  uVar12 = uVar12 + (*__s1 == 0x2b);
  jsonBlobAppendNode(pParse,bVar7 + 3,uVar11 - uVar12,pcVar5 + uVar12);
  goto LAB_001a3ecc;
code_r0x001a3e62:
  pParse->iErr = (u32)uVar18;
  goto LAB_001a3ec9;
LAB_001a363c:
  bVar7 = pcVar5[uVar10];
  uVar11 = uVar10;
  if (""[bVar7] != '\0') {
    uVar11 = uVar10 + 1;
    bVar7 = pcVar5[uVar11];
    if (""[bVar7] == '\0') goto LAB_001a3676;
    uVar11 = uVar10 + 2;
    bVar7 = pcVar5[uVar11];
    if (""[bVar7] == '\0') goto LAB_001a3676;
    uVar10 = uVar10 + 3;
    goto LAB_001a363c;
  }
LAB_001a3676:
  if (bVar7 == bVar8) {
    jsonBlobAppendNode(pParse,uVar21,~uVar12 + uVar11,pcVar5 + (uVar12 + 1));
    goto LAB_001a380b;
  }
  if (bVar7 == 0x5c) {
    uVar10 = uVar11 + 1;
    cVar20 = pcVar5[uVar10];
    switch(cVar20) {
    case 'n':
    case 'r':
    case 't':
      goto switchD_001a3752_caseD_6e;
    case 'o':
    case 'p':
    case 'q':
    case 's':
    case 'w':
      goto switchD_001a3752_caseD_6f;
    case 'u':
      iVar9 = jsonIs4Hex(pcVar5 + (uVar11 + 2));
      if (iVar9 == 0) goto switchD_001a3752_caseD_6f;
switchD_001a3752_caseD_6e:
      if (uVar21 == '\a') {
        uVar21 = '\b';
      }
      goto LAB_001a37e4;
    case 'v':
      break;
    case 'x':
      iVar9 = jsonIs2Hex(pcVar5 + (uVar11 + 2));
      if (iVar9 == 0) goto switchD_001a3752_caseD_6f;
      break;
    default:
      if (cVar20 != '\n') {
        if (cVar20 != '\r') {
          if (cVar20 != '\"') {
            if (cVar20 == '\'') break;
            if (cVar20 != '/') {
              if (cVar20 == '0') break;
              if (((cVar20 == '\\') || (cVar20 == 'b')) || (cVar20 == 'f'))
              goto switchD_001a3752_caseD_6e;
              goto switchD_001a3752_caseD_6f;
            }
          }
          goto switchD_001a3752_caseD_6e;
        }
        if (pcVar5[uVar11 + 2] == '\n') {
          uVar10 = uVar11 + 2;
        }
      }
    }
    pParse->hasNonstd = '\x01';
    uVar21 = '\t';
  }
  else {
    uVar10 = uVar11;
    if ('\x1f' < (char)bVar7) {
      if (bVar7 == 0x22) {
        uVar21 = '\t';
      }
      goto LAB_001a37e4;
    }
    if (bVar7 == 0) {
      pParse->iErr = uVar11;
      goto LAB_001a3ec9;
    }
    pParse->hasNonstd = '\x01';
    uVar21 = '\t';
  }
LAB_001a37e4:
  uVar10 = uVar10 + 1;
  goto LAB_001a363c;
switchD_001a3752_caseD_6f:
  pParse->iErr = uVar10;
  goto LAB_001a3ec9;
LAB_001a3a6e:
  if (lVar19 == 0x78) goto LAB_001a3acf;
  if ((bVar8 == (&aNanInfName[0].c1)[lVar19]) || (bVar8 == (&aNanInfName[0].c2)[lVar19])) {
    cVar20 = (&aNanInfName[0].n)[lVar19];
    iVar9 = sqlite3_strnicmp((char *)__s1,*(char **)((long)&aNanInfName[0].zMatch + lVar19),
                             (int)cVar20);
    if ((iVar9 == 0) && (uVar11 = (int)cVar20 + uVar12, (""[(byte)pcVar5[uVar11]] & 6) == 0)) {
      if ((&aNanInfName[0].eType)[lVar19] == '\x05') {
        jsonBlobAppendNode(pParse,'\x05',5,"9e999");
      }
      else {
        jsonBlobAppendOneByte(pParse,'\0');
      }
      pParse->hasNonstd = '\x01';
      goto LAB_001a3ecc;
    }
  }
  lVar19 = lVar19 + 0x18;
  goto LAB_001a3a6e;
LAB_001a3acf:
  pParse->iErr = uVar12;
LAB_001a3ec9:
  uVar11 = 0xffffffff;
  goto LAB_001a3ecc;
switchD_001a3541_caseD_0:
  uVar11 = 0;
  goto LAB_001a3ecc;
LAB_001a4022:
  if (uVar11 != 0xffffffff) {
    if (uVar11 == 0xfffffffd) {
      uVar11 = pParse->iErr;
      if (pParse->nBlob != uVar4) {
        pParse->hasNonstd = '\x01';
      }
LAB_001a4073:
      jsonBlobChangePayloadSize(pParse,uVar17,pParse->nBlob - uVar4);
      pParse->iDepth = pParse->iDepth - 1;
LAB_001a380b:
      uVar11 = uVar11 + 1;
    }
    else {
      pParse->iErr = uVar22;
      uVar11 = uVar10;
    }
  }
LAB_001a3ecc:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar11;
}

Assistant:

static int jsonTranslateTextToBlob(JsonParse *pParse, u32 i){
  char c;
  u32 j;
  u32 iThis, iStart;
  int x;
  u8 t;
  const char *z = pParse->zJson;
json_parse_restart:
  switch( (u8)z[i] ){
  case '{': {
    /* Parse object */
    iThis = pParse->nBlob;
    jsonBlobAppendNode(pParse, JSONB_OBJECT, pParse->nJson-i, 0);
    if( ++pParse->iDepth > JSON_MAX_DEPTH ){
      pParse->iErr = i;
      return -1;
    }
    iStart = pParse->nBlob;
    for(j=i+1;;j++){
      u32 iBlob = pParse->nBlob;
      x = jsonTranslateTextToBlob(pParse, j);
      if( x<=0 ){
        int op;
        if( x==(-2) ){
          j = pParse->iErr;
          if( pParse->nBlob!=(u32)iStart ) pParse->hasNonstd = 1;
          break;
        }
        j += json5Whitespace(&z[j]);
        op = JSONB_TEXT;
        if( sqlite3JsonId1(z[j])
         || (z[j]=='\\' && jsonIs4HexB(&z[j+1], &op))
        ){
          int k = j+1;
          while( (sqlite3JsonId2(z[k]) && json5Whitespace(&z[k])==0)
            || (z[k]=='\\' && jsonIs4HexB(&z[k+1], &op))
          ){
            k++;
          }
          assert( iBlob==pParse->nBlob );
          jsonBlobAppendNode(pParse, op, k-j, &z[j]);
          pParse->hasNonstd = 1;
          x = k;
        }else{
          if( x!=-1 ) pParse->iErr = j;
          return -1;
        }
      }
      if( pParse->oom ) return -1;
      t = pParse->aBlob[iBlob] & 0x0f;
      if( t<JSONB_TEXT || t>JSONB_TEXTRAW ){
        pParse->iErr = j;
        return -1;
      }
      j = x;
      if( z[j]==':' ){
        j++;
      }else{
        if( jsonIsspace(z[j]) ){
          /* strspn() is not helpful here */
          do{ j++; }while( jsonIsspace(z[j]) );
          if( z[j]==':' ){
            j++;
            goto parse_object_value;
          }
        }
        x = jsonTranslateTextToBlob(pParse, j);
        if( x!=(-5) ){
          if( x!=(-1) ) pParse->iErr = j;
          return -1;
        }
        j = pParse->iErr+1;
      }
    parse_object_value:
      x = jsonTranslateTextToBlob(pParse, j);
      if( x<=0 ){
        if( x!=(-1) ) pParse->iErr = j;
        return -1;
      }
      j = x;
      if( z[j]==',' ){
        continue;
      }else if( z[j]=='}' ){
        break;
      }else{
        if( jsonIsspace(z[j]) ){
          j += 1 + (u32)strspn(&z[j+1], jsonSpaces);
          if( z[j]==',' ){
            continue;
          }else if( z[j]=='}' ){
            break;
          }
        }
        x = jsonTranslateTextToBlob(pParse, j);
        if( x==(-4) ){
          j = pParse->iErr;
          continue;
        }
        if( x==(-2) ){
          j = pParse->iErr;
          break;
        }
      }
      pParse->iErr = j;
      return -1;
    }
    jsonBlobChangePayloadSize(pParse, iThis, pParse->nBlob - iStart);
    pParse->iDepth--;
    return j+1;
  }
  case '[': {
    /* Parse array */
    iThis = pParse->nBlob;
    assert( i<=(u32)pParse->nJson );
    jsonBlobAppendNode(pParse, JSONB_ARRAY, pParse->nJson - i, 0);
    iStart = pParse->nBlob;
    if( pParse->oom ) return -1;
    if( ++pParse->iDepth > JSON_MAX_DEPTH ){
      pParse->iErr = i;
      return -1;
    }
    for(j=i+1;;j++){
      x = jsonTranslateTextToBlob(pParse, j);
      if( x<=0 ){
        if( x==(-3) ){
          j = pParse->iErr;
          if( pParse->nBlob!=iStart ) pParse->hasNonstd = 1;
          break;
        }
        if( x!=(-1) ) pParse->iErr = j;
        return -1;
      }
      j = x;
      if( z[j]==',' ){
        continue;
      }else if( z[j]==']' ){
        break;
      }else{
        if( jsonIsspace(z[j]) ){
          j += 1 + (u32)strspn(&z[j+1], jsonSpaces);
          if( z[j]==',' ){
            continue;
          }else if( z[j]==']' ){
            break;
          }
        }
        x = jsonTranslateTextToBlob(pParse, j);
        if( x==(-4) ){
          j = pParse->iErr;
          continue;
        }
        if( x==(-3) ){
          j = pParse->iErr;
          break;
        }
      }
      pParse->iErr = j;
      return -1;
    }
    jsonBlobChangePayloadSize(pParse, iThis, pParse->nBlob - iStart);
    pParse->iDepth--;
    return j+1;
  }
  case '\'': {
    u8 opcode;
    char cDelim;
    pParse->hasNonstd = 1;
    opcode = JSONB_TEXT;
    goto parse_string;
  case '"':
    /* Parse string */
    opcode = JSONB_TEXT;
  parse_string:
    cDelim = z[i];
    j = i+1;
    while( 1 /*exit-by-break*/ ){
      if( jsonIsOk[(u8)z[j]] ){
        if( !jsonIsOk[(u8)z[j+1]] ){
          j += 1;
        }else if( !jsonIsOk[(u8)z[j+2]] ){
          j += 2;
        }else{
          j += 3;
          continue;
        }
      }
      c = z[j];
      if( c==cDelim ){
        break;
      }else if( c=='\\' ){
        c = z[++j];
        if( c=='"' || c=='\\' || c=='/' || c=='b' || c=='f'
           || c=='n' || c=='r' || c=='t'
           || (c=='u' && jsonIs4Hex(&z[j+1])) ){
          if( opcode==JSONB_TEXT ) opcode = JSONB_TEXTJ;
        }else if( c=='\'' || c=='0' || c=='v' || c=='\n'
           || (0xe2==(u8)c && 0x80==(u8)z[j+1]
                && (0xa8==(u8)z[j+2] || 0xa9==(u8)z[j+2]))
           || (c=='x' && jsonIs2Hex(&z[j+1])) ){
          opcode = JSONB_TEXT5;
          pParse->hasNonstd = 1;
        }else if( c=='\r' ){
          if( z[j+1]=='\n' ) j++;
          opcode = JSONB_TEXT5;
          pParse->hasNonstd = 1;
        }else{
          pParse->iErr = j;
          return -1;
        }
      }else if( c<=0x1f ){
        if( c==0 ){
          pParse->iErr = j;
          return -1;
        }
        /* Control characters are not allowed in canonical JSON string
        ** literals, but are allowed in JSON5 string literals. */
        opcode = JSONB_TEXT5;
        pParse->hasNonstd = 1;
      }else if( c=='"' ){
        opcode = JSONB_TEXT5;
      }
      j++;
    }
    jsonBlobAppendNode(pParse, opcode, j-1-i, &z[i+1]);
    return j+1;
  }
  case 't': {
    if( strncmp(z+i,"true",4)==0 && !sqlite3Isalnum(z[i+4]) ){
      jsonBlobAppendOneByte(pParse, JSONB_TRUE);
      return i+4;
    }
    pParse->iErr = i;
    return -1;
  }
  case 'f': {
    if( strncmp(z+i,"false",5)==0 && !sqlite3Isalnum(z[i+5]) ){
      jsonBlobAppendOneByte(pParse, JSONB_FALSE);
      return i+5;
    }
    pParse->iErr = i;
    return -1;
  }
  case '+': {
    u8 seenE;
    pParse->hasNonstd = 1;
    t = 0x00;            /* Bit 0x01:  JSON5.   Bit 0x02:  FLOAT */
    goto parse_number;
  case '.':
    if( sqlite3Isdigit(z[i+1]) ){
      pParse->hasNonstd = 1;
      t = 0x03;          /* Bit 0x01:  JSON5.   Bit 0x02:  FLOAT */
      seenE = 0;
      goto parse_number_2;
    }
    pParse->iErr = i;
    return -1;
  case '-':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    /* Parse number */
    t = 0x00;            /* Bit 0x01:  JSON5.   Bit 0x02:  FLOAT */
  parse_number:
    seenE = 0;
    assert( '-' < '0' );
    assert( '+' < '0' );
    assert( '.' < '0' );
    c = z[i];

    if( c<='0' ){
      if( c=='0' ){
        if( (z[i+1]=='x' || z[i+1]=='X') && sqlite3Isxdigit(z[i+2]) ){
          assert( t==0x00 );
          pParse->hasNonstd = 1;
          t = 0x01;
          for(j=i+3; sqlite3Isxdigit(z[j]); j++){}
          goto parse_number_finish;
        }else if( sqlite3Isdigit(z[i+1]) ){
          pParse->iErr = i+1;
          return -1;
        }
      }else{
        if( !sqlite3Isdigit(z[i+1]) ){
          /* JSON5 allows for "+Infinity" and "-Infinity" using exactly
          ** that case.  SQLite also allows these in any case and it allows
          ** "+inf" and "-inf". */
          if( (z[i+1]=='I' || z[i+1]=='i')
           && sqlite3StrNICmp(&z[i+1], "inf",3)==0
          ){
            pParse->hasNonstd = 1;
            if( z[i]=='-' ){
              jsonBlobAppendNode(pParse, JSONB_FLOAT, 6, "-9e999");
            }else{
              jsonBlobAppendNode(pParse, JSONB_FLOAT, 5, "9e999");
            }
            return i + (sqlite3StrNICmp(&z[i+4],"inity",5)==0 ? 9 : 4);
          }
          if( z[i+1]=='.' ){
            pParse->hasNonstd = 1;
            t |= 0x01;
            goto parse_number_2;
          }
          pParse->iErr = i;
          return -1;
        }
        if( z[i+1]=='0' ){
          if( sqlite3Isdigit(z[i+2]) ){
            pParse->iErr = i+1;
            return -1;
          }else if( (z[i+2]=='x' || z[i+2]=='X') && sqlite3Isxdigit(z[i+3]) ){
            pParse->hasNonstd = 1;
            t |= 0x01;
            for(j=i+4; sqlite3Isxdigit(z[j]); j++){}
            goto parse_number_finish;
          }
        }
      }
    }

  parse_number_2:
    for(j=i+1;; j++){
      c = z[j];
      if( sqlite3Isdigit(c) ) continue;
      if( c=='.' ){
        if( (t & 0x02)!=0 ){
          pParse->iErr = j;
          return -1;
        }
        t |= 0x02;
        continue;
      }
      if( c=='e' || c=='E' ){
        if( z[j-1]<'0' ){
          if( ALWAYS(z[j-1]=='.') && ALWAYS(j-2>=i) && sqlite3Isdigit(z[j-2]) ){
            pParse->hasNonstd = 1;
            t |= 0x01;
          }else{
            pParse->iErr = j;
            return -1;
          }
        }
        if( seenE ){
          pParse->iErr = j;
          return -1;
        }
        t |= 0x02;
        seenE = 1;
        c = z[j+1];
        if( c=='+' || c=='-' ){
          j++;
          c = z[j+1];
        }
        if( c<'0' || c>'9' ){
          pParse->iErr = j;
          return -1;
        }
        continue;
      }
      break;
    }
    if( z[j-1]<'0' ){
      if( ALWAYS(z[j-1]=='.') && ALWAYS(j-2>=i) && sqlite3Isdigit(z[j-2]) ){
        pParse->hasNonstd = 1;
        t |= 0x01;
      }else{
        pParse->iErr = j;
        return -1;
      }
    }
  parse_number_finish:
    assert( JSONB_INT+0x01==JSONB_INT5 );
    assert( JSONB_FLOAT+0x01==JSONB_FLOAT5 );
    assert( JSONB_INT+0x02==JSONB_FLOAT );
    if( z[i]=='+' ) i++;
    jsonBlobAppendNode(pParse, JSONB_INT+t, j-i, &z[i]);
    return j;
  }
  case '}': {
    pParse->iErr = i;
    return -2;  /* End of {...} */
  }
  case ']': {
    pParse->iErr = i;
    return -3;  /* End of [...] */
  }
  case ',': {
    pParse->iErr = i;
    return -4;  /* List separator */
  }
  case ':': {
    pParse->iErr = i;
    return -5;  /* Object label/value separator */
  }
  case 0: {
    return 0;   /* End of file */
  }
  case 0x09:
  case 0x0a:
  case 0x0d:
  case 0x20: {
    i += 1 + (u32)strspn(&z[i+1], jsonSpaces);
    goto json_parse_restart;
  }
  case 0x0b:
  case 0x0c:
  case '/':
  case 0xc2:
  case 0xe1:
  case 0xe2:
  case 0xe3:
  case 0xef: {
    j = json5Whitespace(&z[i]);
    if( j>0 ){
      i += j;
      pParse->hasNonstd = 1;
      goto json_parse_restart;
    }
    pParse->iErr = i;
    return -1;
  }
  case 'n': {
    if( strncmp(z+i,"null",4)==0 && !sqlite3Isalnum(z[i+4]) ){
      jsonBlobAppendOneByte(pParse, JSONB_NULL);
      return i+4;
    }
    /* fall-through into the default case that checks for NaN */
    /* no break */ deliberate_fall_through
  }
  default: {
    u32 k;
    int nn;
    c = z[i];
    for(k=0; k<sizeof(aNanInfName)/sizeof(aNanInfName[0]); k++){
      if( c!=aNanInfName[k].c1 && c!=aNanInfName[k].c2 ) continue;
      nn = aNanInfName[k].n;
      if( sqlite3StrNICmp(&z[i], aNanInfName[k].zMatch, nn)!=0 ){
        continue;
      }
      if( sqlite3Isalnum(z[i+nn]) ) continue;
      if( aNanInfName[k].eType==JSONB_FLOAT ){
        jsonBlobAppendNode(pParse, JSONB_FLOAT, 5, "9e999");
      }else{
        jsonBlobAppendOneByte(pParse, JSONB_NULL);
      }
      pParse->hasNonstd = 1;
      return i + nn;
    }
    pParse->iErr = i;
    return -1;  /* Syntax error */
  }
  } /* End switch(z[i]) */
}